

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async_websocket.hpp
# Opt level: O0

void __thiscall
m2d::savanna::async_websocket::raw_stream_logic::on_ssl_handshake_l
          (raw_stream_logic *this,error_code ec)

{
  raw_stream_logic *this_local;
  error_code ec_local;
  
  return;
}

Assistant:

void on_handshake_l(beast::error_code ec) override
			{
				// success
				if (delegate_) {
					auto control_callback = [this](beast::websocket::frame_type kind, boost::string_view payload) {
						delegate_->control_callback(kind, payload);
					};
					raw_stream_->control_callback(control_callback);
					delegate_->on_ready();
				}
			}